

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

void * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::element_ptr(consume_operation *this)

{
  bool bVar1;
  void *pvVar2;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty(&this->m_consume_data);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x403);
  }
  pvVar2 = detail::
           LFQueue_Base<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
           ::get_element((this->m_consume_data).m_control,
                         SUB41(((uint)(this->m_consume_data).m_next_ptr & 4) >> 2,0));
  return pvVar2;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_element(m_consume_data.m_control, m_consume_data.external());
            }